

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

String * File::getDirectoryName(String *__return_storage_ptr__,String *file)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong length;
  ulong uVar4;
  
  pcVar3 = String::operator_cast_to_char_(file);
  uVar2 = file->data->len;
  uVar4 = uVar2;
  do {
    if (pcVar3 + (uVar4 - 1) < pcVar3) {
      __return_storage_ptr__->data = &__return_storage_ptr__->_data;
      (__return_storage_ptr__->_data).ref = 0;
      (__return_storage_ptr__->_data).str = ".";
      (__return_storage_ptr__->_data).len = 1;
      return __return_storage_ptr__;
    }
    cVar1 = pcVar3[uVar4 - 1];
    uVar4 = uVar4 - 1;
  } while ((cVar1 != '\\') && (cVar1 != '/'));
  length = uVar2;
  if (uVar4 < uVar2) {
    length = uVar4;
  }
  if ((long)uVar4 < 0) {
    length = uVar2;
  }
  String::String(__return_storage_ptr__,file->data->str,length);
  return __return_storage_ptr__;
}

Assistant:

String File::getDirectoryName(const String& file)
{
  const char* start = file;
  const char* pos = &start[file.length() - 1];
  for(; pos >= start; --pos)
    if(*pos == '\\' || *pos == '/')
      return file.substr(0, pos - start);
  return String(".");
}